

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfect_aggregate_hashtable.cpp
# Opt level: O0

void __thiscall
duckdb::PerfectAggregateHashTable::Scan
          (PerfectAggregateHashTable *this,idx_t *scan_position,DataChunk *result)

{
  uint uVar1;
  uchar **ppuVar2;
  type pbVar3;
  reference pvVar4;
  idx_t shift_00;
  DataChunk *in_RDX;
  ulong *in_RSI;
  long in_RDI;
  RowOperationsState row_state;
  idx_t i;
  idx_t shift;
  idx_t entry_count;
  uint32_t group_values [2048];
  uchar **data_pointers;
  ArenaAllocator *in_stack_ffffffffffffdf68;
  RowOperationsState *in_stack_ffffffffffffdf70;
  Vector *in_stack_ffffffffffffdfb8;
  ulong entry_count_00;
  idx_t count_p;
  ArenaAllocator *in_stack_ffffffffffffdfd8;
  _Head_base<0UL,_duckdb::Vector_*,_false> in_stack_ffffffffffffdfe0;
  idx_t in_stack_ffffffffffffe000;
  DataChunk *in_stack_ffffffffffffe008;
  Vector *in_stack_ffffffffffffe010;
  TupleDataLayout *in_stack_ffffffffffffe018;
  RowOperationsState *in_stack_ffffffffffffe020;
  
  ppuVar2 = FlatVector::GetData<unsigned_char*>((Vector *)0x79ea65);
  count_p = 0;
  do {
    if (*(ulong *)(in_RDI + 0xe0) <= *in_RSI) {
LAB_0079eb4a:
      if (count_p != 0) {
        shift_00 = *(idx_t *)(in_RDI + 0xd8);
        for (entry_count_00 = 0; entry_count_00 < *(ulong *)(in_RDI + 0xf0);
            entry_count_00 = entry_count_00 + 1) {
          pvVar4 = vector<unsigned_long,_true>::operator[]
                             ((vector<unsigned_long,_true> *)in_stack_ffffffffffffdf70,
                              (size_type)in_stack_ffffffffffffdf68);
          shift_00 = shift_00 - *pvVar4;
          in_stack_ffffffffffffdf70 = (RowOperationsState *)&stack0xffffffffffffdfd8;
          vector<duckdb::Value,_true>::operator[]
                    ((vector<duckdb::Value,_true> *)in_stack_ffffffffffffdf70,
                     (size_type)in_stack_ffffffffffffdf68);
          vector<unsigned_long,_true>::operator[]
                    ((vector<unsigned_long,_true> *)in_stack_ffffffffffffdf70,
                     (size_type)in_stack_ffffffffffffdf68);
          vector<duckdb::Vector,_true>::operator[]
                    ((vector<duckdb::Vector,_true> *)in_stack_ffffffffffffdf70,
                     (size_type)in_stack_ffffffffffffdf68);
          ReconstructGroupVector
                    ((uint32_t *)in_stack_ffffffffffffdfe0._M_head_impl,
                     (Value *)in_stack_ffffffffffffdfd8,count_p,shift_00,entry_count_00,
                     in_stack_ffffffffffffdfb8);
        }
        DataChunk::SetCardinality(in_RDX,count_p);
        unique_ptr<duckdb::ArenaAllocator,_std::default_delete<duckdb::ArenaAllocator>,_true>::
        operator*((unique_ptr<duckdb::ArenaAllocator,_std::default_delete<duckdb::ArenaAllocator>,_true>
                   *)in_stack_ffffffffffffdf70);
        RowOperationsState::RowOperationsState(in_stack_ffffffffffffdf70,in_stack_ffffffffffffdf68);
        shared_ptr<duckdb::TupleDataLayout,_true>::operator*
                  ((shared_ptr<duckdb::TupleDataLayout,_true> *)in_stack_ffffffffffffdf70);
        RowOperations::FinalizeStates
                  (in_stack_ffffffffffffe020,in_stack_ffffffffffffe018,in_stack_ffffffffffffe010,
                   in_stack_ffffffffffffe008,in_stack_ffffffffffffe000);
        RowOperationsState::~RowOperationsState((RowOperationsState *)0x79ecc4);
      }
      return;
    }
    pbVar3 = unique_ptr<bool[],_std::default_delete<bool>,_false>::operator[]
                       ((unique_ptr<bool[],_std::default_delete<bool>,_false> *)
                        in_stack_ffffffffffffdf70,(size_t)in_stack_ffffffffffffdf68);
    if ((*pbVar3 & 1U) != 0) {
      ppuVar2[count_p] = (uchar *)(*(long *)(in_RDI + 0xf8) + *(long *)(in_RDI + 0xe8) * *in_RSI);
      uVar1 = NumericCast<unsigned_int,unsigned_long,void>(0x79eaf7);
      *(uint *)(&stack0xffffffffffffdfd8 + count_p * 4) = uVar1;
      count_p = count_p + 1;
      if (count_p == 0x800) {
        *in_RSI = *in_RSI + 1;
        goto LAB_0079eb4a;
      }
    }
    *in_RSI = *in_RSI + 1;
  } while( true );
}

Assistant:

void PerfectAggregateHashTable::Scan(idx_t &scan_position, DataChunk &result) {
	auto data_pointers = FlatVector::GetData<data_ptr_t>(addresses);
	uint32_t group_values[STANDARD_VECTOR_SIZE];

	// iterate over the HT until we either have exhausted the entire HT, or
	idx_t entry_count = 0;
	for (; scan_position < total_groups; scan_position++) {
		if (group_is_set[scan_position]) {
			// this group is set: add it to the set of groups to extract
			data_pointers[entry_count] = data + tuple_size * scan_position;
			group_values[entry_count] = NumericCast<uint32_t>(scan_position);
			entry_count++;
			if (entry_count == STANDARD_VECTOR_SIZE) {
				scan_position++;
				break;
			}
		}
	}
	if (entry_count == 0) {
		// no entries found
		return;
	}
	// first reconstruct the groups from the group index
	idx_t shift = total_required_bits;
	for (idx_t i = 0; i < grouping_columns; i++) {
		shift -= required_bits[i];
		ReconstructGroupVector(group_values, group_minima[i], required_bits[i], shift, entry_count, result.data[i]);
	}
	// then construct the payloads
	result.SetCardinality(entry_count);
	RowOperationsState row_state(*aggregate_allocator);
	RowOperations::FinalizeStates(row_state, *layout_ptr, addresses, result, grouping_columns);
}